

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(BlockManager *this)

{
  long lVar1;
  int iVar2;
  reference pvVar3;
  BlockManager *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  int max_blockfile;
  int file_number;
  set<int,_std::less<int>,_std::allocator<int>_> block_files_to_prune;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff78;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  BlockManager *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff78._M_node,
             (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::recursive_mutex> *)0x10fa33a);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this_00 = in_RDI;
  iVar2 = ScanAndUnlinkAlreadyPrunedFiles::anon_class_8_1_8991fb9c::operator()
                    (in_stack_ffffffffffffff88);
  if ((in_RDI->m_have_pruned & 1U) != 0) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      pvVar3 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                         ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                          in_stack_ffffffffffffff78._M_node,
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      if (pvVar3->nSize == 0) {
        pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_ffffffffffffff78._M_node,
                           (value_type_conflict2 *)
                           CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
        in_stack_ffffffffffffff78 = pVar4.first._M_node;
        in_stack_ffffffffffffff77 = pVar4.second;
      }
    }
    UnlinkPrunedFiles(this_00,(set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT44(iVar5,in_stack_ffffffffffffffa8));
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::ScanAndUnlinkAlreadyPrunedFiles()
{
    AssertLockHeld(::cs_main);
    int max_blockfile = WITH_LOCK(cs_LastBlockFile, return this->MaxBlockfileNum());
    if (!m_have_pruned) {
        return;
    }

    std::set<int> block_files_to_prune;
    for (int file_number = 0; file_number < max_blockfile; file_number++) {
        if (m_blockfile_info[file_number].nSize == 0) {
            block_files_to_prune.insert(file_number);
        }
    }

    UnlinkPrunedFiles(block_files_to_prune);
}